

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc.cpp
# Opt level: O0

void __thiscall Moc::parseMocInclude(Moc *this)

{
  long lVar1;
  Parser *in_RDI;
  long in_FS_OFFSET;
  QByteArray include;
  undefined8 in_stack_ffffffffffffffb8;
  parameter_type t;
  Data *local_28;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  Parser::next(in_RDI,(Token)((ulong)in_stack_ffffffffffffffb8 >> 0x20));
  local_28 = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  lexemUntil((Moc *)&DAT_aaaaaaaaaaaaaaaa,0xaaaaaaaa);
  t = (parameter_type)0x1;
  QByteArray::remove((QByteArray *)&local_28,(char *)0x0);
  QByteArray::chop((QByteArray *)in_RDI,(qsizetype)t);
  QList<QByteArray>::append((QList<QByteArray> *)in_RDI,t);
  QByteArray::~QByteArray((QByteArray *)0x152008);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Moc::parseMocInclude()
{
    next(LPAREN);
    QByteArray include = lexemUntil(RPAREN);
    // remove parentheses
    include.remove(0, 1);
    include.chop(1);
    includeFiles.append(include);
}